

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator*(TPZSkylMatrix<double> *this,double value)

{
  int iVar1;
  undefined4 extraout_var;
  int64_t iVar2;
  double **ppdVar3;
  TPZSkylMatrix<double> *in_RSI;
  TPZSkylMatrix<double> *in_RDI;
  double in_XMM0_Qa;
  int64_t i;
  double *elemRes;
  int64_t colsize;
  int64_t col;
  TPZSkylMatrix<double> *res;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffb0;
  long lVar4;
  double *local_48;
  int64_t local_28;
  
  TPZSkylMatrix(in_stack_ffffffffffffffb0,in_RSI);
  local_28 = 0;
  while( true ) {
    iVar2 = local_28;
    iVar1 = (*(in_RSI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])();
    if ((long)CONCAT44(extraout_var,iVar1) <= iVar2) break;
    iVar2 = Size((TPZSkylMatrix<double> *)CONCAT44(extraout_var,iVar1),iVar2);
    ppdVar3 = TPZVec<double_*>::operator[](&in_RDI->fElem,local_28);
    local_48 = *ppdVar3;
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      *local_48 = in_XMM0_Qa * *local_48;
      local_48 = local_48 + 1;
    }
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator*(const TVar value ) const
{
	auto res(*this);
	
	for ( int64_t col = 0; col < this->Dim(); col++ )
    {
		// Aloca nova coluna para o resultado.
		int64_t colsize = Size(col);
		// Efetua a SOMA.
		TVar *elemRes  = res.fElem[col];
		for ( int64_t i = 0; i < colsize; i++ )
			*elemRes++ *= value;
    }
	
	return res;
}